

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O3

void __thiscall
tonk::gateway::StateMachine::OnXMLResponse(StateMachine *this,ParsedURL *sourceUrl,ParsedXML *xml)

{
  ostringstream *poVar1;
  pointer pcVar2;
  undefined8 uVar3;
  int iVar4;
  OutputWorker *pOVar5;
  ostream *poVar6;
  uint uVar7;
  ulong uVar8;
  pointer pCVar9;
  Result result;
  stringstream full;
  undefined1 local_3f0 [8];
  undefined1 local_3e8 [16];
  char local_3d8 [16];
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  char *local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  undefined2 local_388;
  anon_union_16_3_a3f0114d_for___in6_u local_380;
  unsigned_long uStack_370;
  data_union local_368;
  undefined8 uStack_34c;
  undefined1 local_340 [32];
  _Alloc_hider local_320;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  _Alloc_hider local_300;
  size_type local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  undefined2 local_2e0;
  undefined1 local_2d8 [24];
  unsigned_long uStack_2c0;
  data_union local_2b8;
  _Alloc_hider local_298;
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  _Alloc_hider local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  undefined1 local_238 [16];
  pointer local_228;
  bool local_220;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  local_3e8._0_8_ = local_3d8;
  pcVar2 = (sourceUrl->FullURL)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3e8,pcVar2,pcVar2 + (sourceUrl->FullURL)._M_string_length);
  local_3c8[0] = local_3b8;
  pcVar2 = (sourceUrl->XMLPath)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3c8,pcVar2,pcVar2 + (sourceUrl->XMLPath)._M_string_length);
  local_3a8 = local_3a0._M_local_buf + 8;
  pcVar2 = (sourceUrl->IP)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3a8,pcVar2,pcVar2 + (sourceUrl->IP)._M_string_length);
  local_388 = sourceUrl->Port;
  local_380._0_4_ = (sourceUrl->IPAddr).type_;
  local_380._4_4_ = (sourceUrl->IPAddr).ipv4_address_;
  local_380._8_8_ = *(undefined8 *)&(sourceUrl->IPAddr).ipv6_address_.addr_.__in6_u;
  uStack_370 = *(unsigned_long *)((long)&(sourceUrl->IPAddr).ipv6_address_.addr_.__in6_u + 8);
  local_368._0_8_ = (sourceUrl->IPAddr).ipv6_address_.scope_id_;
  local_368.v4.sin_zero = (uchar  [8])*(undefined8 *)&(sourceUrl->TCPEndpoint).impl_.data_;
  uVar3 = *(undefined8 *)((long)&(sourceUrl->TCPEndpoint).impl_.data_ + 8);
  uStack_34c = *(undefined8 *)((long)&(sourceUrl->TCPEndpoint).impl_.data_ + 0x14);
  local_368.v6.sin6_scope_id =
       (uint32_t)((ulong)*(undefined8 *)((long)&(sourceUrl->TCPEndpoint).impl_.data_ + 0xc) >> 0x20)
  ;
  local_368._16_4_ = (undefined4)uVar3;
  local_368._20_4_ = (undefined4)((ulong)uVar3 >> 0x20);
  if ((xml->URLBase)._M_string_length != 0) {
    ParsedURL::Parse((ParsedURL *)local_3f0,(string *)local_3e8);
    if (local_3f0 != (undefined1  [8])0x0) {
      Result::ToJson_abi_cxx11_((string *)local_1b8,(Result *)local_3f0);
      if (DAT_001e1cd0 < 5) {
        poVar1 = (ostringstream *)(local_340 + 0x10);
        local_340._0_8_ = ModuleLogger;
        local_340._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,DAT_001e1d00,DAT_001e1d08);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Failed to parse URLBase: ",0x19);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(char *)local_1b8._0_8_,local_1b8._8_8_);
        pOVar5 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar5,(LogStringBuffer *)local_340);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)&uStack_2c0);
      }
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_);
      }
      Result::~Result((Result *)local_3f0);
      goto LAB_0015c28e;
    }
    Result::~Result((Result *)local_3f0);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(local_1b8 + 0x10),local_3a8,local_3a0._M_allocated_capacity);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,(xml->ControlURL)._M_dataplus._M_p,(xml->ControlURL)._M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_3e8,(string *)local_340);
  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_);
  }
  uVar3 = local_3e8._0_8_;
  pCVar9 = (this->ControlEndpoints).
           super__Vector_base<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = (int)((long)(this->ControlEndpoints).
                      super__Vector_base<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar9 >> 3) * -0x6eb3e453;
  if (0 < (int)uVar7) {
    uVar8 = 0;
    do {
      iVar4 = strcasecmp((char *)uVar3,(pCVar9->URL).FullURL._M_dataplus._M_p);
      if (iVar4 == 0) {
        pCVar9->EndpointActive = true;
        BeginControlSOAPRequests(this,(int)uVar8);
        goto LAB_0015c26d;
      }
      uVar8 = uVar8 + 1;
      pCVar9 = pCVar9 + 1;
    } while ((uVar7 & 0x7fffffff) != uVar8);
  }
  if (DAT_001e1cd0 < 3) {
    poVar1 = (ostringstream *)(local_340 + 0x10);
    local_340._0_8_ = ModuleLogger;
    local_340._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,DAT_001e1d00,DAT_001e1d08);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Found control endpoint via gateway: ",0x24);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(char *)local_3e8._0_8_,local_3e8._8_8_);
    pOVar5 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar5,(LogStringBuffer *)local_340);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)&uStack_2c0);
  }
  local_340._0_8_ = local_340 + 0x10;
  local_298._M_p = (pointer)&local_288;
  local_340._8_8_ = 0;
  local_340[0x10] = (ostringstream)0x0;
  local_318 = 0;
  local_310._M_local_buf[0] = '\0';
  local_2f8 = 0;
  local_2f0._M_local_buf[0] = '\0';
  local_2d8._0_4_ = ipv4;
  local_2d8._4_4_ = (in4_addr_type)0x0;
  local_2d8._8_8_ = 0;
  local_2d8._16_8_ = 0;
  uStack_2c0 = 0;
  local_238 = ZEXT416(0) << 0x40;
  local_2b8.v6.sin6_scope_id = 0;
  local_2b8._8_4_ = 0;
  local_2b8._12_4_ = 0;
  local_2b8._16_4_ = 0;
  local_2b8._20_4_ = 0;
  local_2b8._0_8_ = 2;
  local_290 = 0;
  local_288._M_local_buf[0] = '\0';
  local_270 = 0;
  local_268._M_local_buf[0] = '\0';
  local_250 = 0;
  local_248._M_local_buf[0] = '\0';
  local_228 = (pointer)0x0;
  local_220 = true;
  local_320._M_p = (pointer)&local_310;
  local_300._M_p = (pointer)&local_2f0;
  local_278._M_p = (pointer)&local_268;
  local_258._M_p = (pointer)&local_248;
  std::__cxx11::string::_M_assign((string *)local_340);
  std::__cxx11::string::_M_assign((string *)&local_320);
  std::__cxx11::string::_M_assign((string *)&local_300);
  local_2e0 = local_388;
  local_2d8._0_8_ = local_380._0_8_;
  local_2d8._8_8_ = local_380._8_8_;
  local_2d8._16_8_ = uStack_370;
  uStack_2c0 = local_368._0_8_;
  local_2b8._16_4_ = local_368.v6.sin6_scope_id;
  local_2b8._20_4_ = (undefined4)uStack_34c;
  local_2b8.v6.sin6_scope_id = (uint32_t)((ulong)uStack_34c >> 0x20);
  local_2b8.base.sa_family._0_1_ = local_368.base.sa_data[6];
  local_2b8.base.sa_family._1_1_ = local_368.base.sa_data[7];
  local_2b8.base.sa_data[0] = local_368.base.sa_data[8];
  local_2b8.base.sa_data[1] = local_368.base.sa_data[9];
  local_2b8.base.sa_data[2] = local_368.base.sa_data[10];
  local_2b8.base.sa_data[3] = local_368.base.sa_data[0xb];
  local_2b8.base.sa_data[4] = local_368.base.sa_data[0xc];
  local_2b8.base.sa_data[5] = local_368.base.sa_data[0xd];
  local_2b8._8_4_ = local_368._16_4_;
  local_2b8._12_4_ = local_368._20_4_;
  std::__cxx11::string::_M_assign((string *)&local_298);
  std::__cxx11::string::_M_assign((string *)&local_278);
  std::__cxx11::string::_M_assign((string *)&local_258);
  std::vector<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>::
  push_back(&this->ControlEndpoints,(value_type *)local_340);
  BeginControlSOAPRequests
            (this,(int)((ulong)((long)(this->ControlEndpoints).
                                      super__Vector_base<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->ControlEndpoints).
                                     super__Vector_base<tonk::gateway::ControlEndpoint,_std::allocator<tonk::gateway::ControlEndpoint>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x6eb3e453
                  + -1);
  std::vector<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_>::
  ~vector((vector<tonk::gateway::ControlRequest,_std::allocator<tonk::gateway::ControlRequest>_> *)
          local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_p != &local_248) {
    operator_delete(local_258._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_p != &local_268) {
    operator_delete(local_278._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_p != &local_288) {
    operator_delete(local_298._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_p != &local_2f0) {
    operator_delete(local_300._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_p != &local_310) {
    operator_delete(local_320._M_p);
  }
  if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
    operator_delete((void *)local_340._0_8_);
  }
LAB_0015c26d:
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
LAB_0015c28e:
  if (local_3a8 != local_3a0._M_local_buf + 8) {
    operator_delete(local_3a8);
  }
  if (local_3c8[0] != local_3b8) {
    operator_delete(local_3c8[0]);
  }
  if ((char *)local_3e8._0_8_ != local_3d8) {
    operator_delete((void *)local_3e8._0_8_);
  }
  return;
}

Assistant:

void StateMachine::OnXMLResponse(const ParsedURL& sourceUrl, const ParsedXML& xml)
{
    // Default to using the source host/port
    ParsedURL url = sourceUrl;

    // But if a URLBase is specified, then use that
    if (!xml.URLBase.empty())
    {
        Result result = url.Parse(xml.URLBase);
        if (result.IsFail()) {
            ModuleLogger.Error("Failed to parse URLBase: ", result.ToJson());
            return;
        }
    }

    // Fix up the FullURL before using it to compare URLs
    std::stringstream full;
    full << url.IP << ":" << url.Port << xml.ControlURL;
    url.FullURL = full.str();

    // Find it if it is already in the list
    const int controlCount = (int)ControlEndpoints.size();
    for (int controlIndex = 0; controlIndex < controlCount; ++controlIndex)
    {
        auto& control = ControlEndpoints[controlIndex];

        // If the control URL was found:
        if (control.URL == url)
        {
            // Reactivate endpoint if it is found again on the LAN.
            // This is helpful if we leave and rejoin the same LAN
            control.EndpointActive = true;

            BeginControlSOAPRequests(controlIndex);

            return;
        }
    }

    ModuleLogger.Info("Found control endpoint via gateway: ", url.FullURL);

    ControlEndpoint control;
    control.URL = url;
    control.XML = xml;

    ControlEndpoints.push_back(control);
    const int controlIndex = (int)ControlEndpoints.size() - 1;

    BeginControlSOAPRequests(controlIndex);
}